

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::WriteHeader(cmGraphVizWriter *this,cmGeneratedFileStream *fs,string *name)

{
  ostream *poVar1;
  char in_R8B;
  string escapedGraphName;
  char local_31;
  string local_30;
  
  cmsys::SystemTools::EscapeChars_abi_cxx11_
            (&local_30,(SystemTools *)(name->_M_dataplus)._M_p,"\"",(char *)0x5c,in_R8B);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"digraph \"",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fs,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" {\n",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->GraphHeader)._M_dataplus._M_p,
                      (this->GraphHeader)._M_string_length);
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_31,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteHeader(cmGeneratedFileStream& fs,
                                   const std::string& name)
{
  auto const escapedGraphName = EscapeForDotFile(name);
  fs << "digraph \"" << escapedGraphName << "\" {\n"
     << this->GraphHeader << '\n';
}